

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void massagekinetic(Item *q1,Item *q2,Item *q3,Item *q4,int sensused)

{
  Symbol *pSVar1;
  Symbol *pSVar2;
  Item *pIVar3;
  int iVar4;
  Rlist *pRVar5;
  Symbol **ppSVar6;
  char **ppcVar7;
  char *pcVar8;
  Item *in_RCX;
  Item *in_RDX;
  long in_RSI;
  int in_R8D;
  Item *q1_1;
  Item *qend;
  Item *qb;
  Item *qexp;
  Item *q_1;
  char buf1 [8192];
  int dim;
  Rlist *r;
  Rterm *rt;
  Reaction *r1;
  Symbol *fun;
  Symbol *s;
  Item *qv;
  Item *afterbrace;
  Item *qs;
  Item *q;
  int ncons;
  int order;
  int i;
  int count;
  int in_stack_ffffffffffffdf38;
  int in_stack_ffffffffffffdf3c;
  Item *in_stack_ffffffffffffdf40;
  undefined7 in_stack_ffffffffffffdf48;
  undefined1 in_stack_ffffffffffffdf4f;
  char *in_stack_ffffffffffffdf50;
  Item *pIVar9;
  Item *q2_00;
  Item *pIVar10;
  Item *local_2090;
  Item local_2088 [8];
  int in_stack_ffffffffffffe084;
  Item *in_stack_ffffffffffffe088;
  int in_stack_ffffffffffffe094;
  Rterm *local_78;
  Reaction *local_70;
  Item *local_50;
  Item *local_48;
  Item *local_40;
  int local_30;
  int local_2c;
  int local_28;
  
  local_28 = 0;
  pSVar1 = *(Symbol **)(in_RSI + 8);
  if (((pSVar1->subtype & 0x600U) != 0) && ((pSVar1->u).i != 0)) {
    diag((char *)in_stack_ffffffffffffdf40,
         (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  }
  pSVar1->subtype = pSVar1->subtype | 0x400;
  numlist = numlist + 1;
  (pSVar1->u).i = numlist;
  sprintf(buf,"\n/* _kinetic_ %s %s */\n#ifndef INSIDE_NMODL\n#define INSIDE_NMODL\n#endif\n",
          *(undefined8 *)(*(long *)(in_RSI + 8) + 0x48),suffix);
  linsertstr(in_stack_ffffffffffffdf40,
             (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  sprintf(buf,
          "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint"
          ,*(undefined8 *)(*(long *)(in_RSI + 8) + 0x48),suffix);
  replacstr(in_stack_ffffffffffffdf40,
            (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  sprintf(buf,"%s%s<code_to_enable>::operator()",*(undefined8 *)(*(long *)(in_RSI + 8) + 0x48),
          suffix);
  replacstr(in_stack_ffffffffffffdf40,
            (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  insertstr(in_stack_ffffffffffffdf40,
            (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  if (vectorize != 0) {
    kin_vect1(in_stack_ffffffffffffdf40,
              (Item *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),(Item *)0x111b65
             );
    vectorize_substitute
              (in_stack_ffffffffffffdf40,
               (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  }
  insertstr(in_stack_ffffffffffffdf40,
            (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  sprintf(buf,"{int _reset=0;\n");
  vectorize_substitute
            (in_stack_ffffffffffffdf40,
             (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  local_50 = in_RDX->next;
  if ((local_50->itemtype == 0x143) &&
     (iVar4 = strcmp((local_50->element).str,"double"), iVar4 == 0)) {
    local_50 = local_50->next;
    while( true ) {
      in_stack_ffffffffffffdf4f = true;
      if (local_50->itemtype == 0x143) {
        iVar4 = strcmp((local_50->element).str,";\n");
        in_stack_ffffffffffffdf4f = iVar4 != 0;
      }
      if ((bool)in_stack_ffffffffffffdf4f == false) break;
      local_50 = local_50->next;
    }
    if ((local_50->itemtype == 0x143) && (iVar4 = strcmp((local_50->element).str,";\n"), iVar4 == 0)
       ) {
      local_50 = local_50->next;
    }
  }
  insertstr(in_stack_ffffffffffffdf40,
            (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  local_30 = 0;
  for (local_2c = 0x41; local_2c < 0x7b; local_2c = local_2c + 1) {
    for (local_48 = symlist[local_2c]->next; local_48 != symlist[local_2c];
        local_48 = local_48->next) {
      pIVar10 = (local_48->element).itm;
      if (((pIVar10->itemtype == 0x13e) && (((ulong)(pIVar10->element).itm & 0x10) != 0)) &&
         (*(int *)&pIVar10[1].next != 0)) {
        *(undefined4 *)&pIVar10[1].next = 0;
      }
    }
  }
  for (local_70 = conslist; local_70 != (Reaction *)0x0; local_70 = local_70->reactnext) {
    for (local_78 = local_70->rterm[0]; local_78 != (Rterm *)0x0; local_78 = local_78->rnext) {
      if (local_78->isstate != 0) {
        local_78->sym->used = -1;
      }
    }
  }
  for (local_70 = reactlist; local_70 != (Reaction *)0x0; local_70 = local_70->reactnext) {
    for (local_78 = local_70->rterm[0]; local_78 != (Rterm *)0x0; local_78 = local_78->rnext) {
      if (local_78->isstate != 0) {
        local_78->sym->used = -1;
      }
    }
    for (local_78 = local_70->rterm[1]; local_78 != (Rterm *)0x0; local_78 = local_78->rnext) {
      if (local_78->isstate != 0) {
        local_78->sym->used = -1;
      }
    }
  }
  local_70 = conslist;
  do {
    iVar4 = local_28;
    if (local_70 == (Reaction *)0x0) {
      for (local_2c = 0x41; local_2c < 0x7b; local_2c = local_2c + 1) {
        for (local_48 = symlist[local_2c]->next; local_48 != symlist[local_2c];
            local_48 = local_48->next) {
          pIVar10 = (local_48->element).itm;
          if (((pIVar10->itemtype == 0x13e) && (((ulong)(pIVar10->element).itm & 0x10) != 0)) &&
             (*(int *)&pIVar10[1].next == -1)) {
            *(int *)(pIVar10 + 2) = local_28;
            local_30 = local_30 + 1;
            *(int *)&pIVar10[1].next = local_30;
            if (((ulong)(pIVar10->element).itm & 0x20) == 0) {
              local_28 = local_28 + 1;
            }
            else {
              local_28 = *(int *)&pIVar10[1].prev + local_28;
            }
          }
        }
      }
      if (local_28 == 0) {
        diag((char *)in_stack_ffffffffffffdf40,
             (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
      }
      pSVar1->used = local_28;
      sprintf(buf,"_slist%d",(ulong)(uint)numlist);
      add_global_var(in_stack_ffffffffffffdf50,
                     (char *)CONCAT17(in_stack_ffffffffffffdf4f,in_stack_ffffffffffffdf48),
                     (int)((ulong)in_stack_ffffffffffffdf40 >> 0x20),(int)in_stack_ffffffffffffdf40,
                     in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38);
      sprintf(buf,"_dlist%d",(ulong)(uint)numlist);
      add_global_var(in_stack_ffffffffffffdf50,
                     (char *)CONCAT17(in_stack_ffffffffffffdf4f,in_stack_ffffffffffffdf48),
                     (int)((ulong)in_stack_ffffffffffffdf40 >> 0x20),(int)in_stack_ffffffffffffdf40,
                     in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38);
      insertstr(in_stack_ffffffffffffdf40,
                (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
      movelist(in_stack_ffffffffffffdf40,
               (Item *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
               (List *)0x112293);
      pRVar5 = (Rlist *)emalloc((uint)((ulong)in_stack_ffffffffffffdf40 >> 0x20));
      pRVar5->reaction = reactlist;
      reactlist = (Reaction *)0x0;
      pRVar5->sens_parm = sens_parm;
      ppSVar6 = (Symbol **)emalloc((uint)((ulong)in_stack_ffffffffffffdf40 >> 0x20));
      pRVar5->symorder = ppSVar6;
      pRVar5->slist_decl = 0;
      for (local_2c = 0x41; local_2c < 0x7b; local_2c = local_2c + 1) {
        for (local_48 = symlist[local_2c]->next; local_48 != symlist[local_2c];
            local_48 = local_48->next) {
          pSVar2 = (local_48->element).sym;
          if (((pSVar2->type == 0x13e) && ((pSVar2->subtype & 0x10U) != 0)) &&
             ((pSVar2->used != 0 && (pRVar5->symorder[pSVar2->used + -1] = pSVar2, in_R8D != 0)))) {
            add_sens_statelist((Symbol *)0x1123e7);
          }
        }
      }
      pRVar5->nsym = local_30;
      pRVar5->ncons = iVar4;
      pRVar5->position = local_50;
      pRVar5->endbrace = in_RCX->prev;
      if (in_R8D != 0) {
        sensmassage(in_stack_ffffffffffffe094,in_stack_ffffffffffffe088,in_stack_ffffffffffffe084);
      }
      pRVar5->sym = pSVar1;
      pRVar5->rlistnext = rlist;
      rlist = pRVar5;
      pRVar5 = (Rlist *)emalloc((uint)((ulong)in_stack_ffffffffffffdf40 >> 0x20));
      pRVar5->reaction = conslist;
      conslist = (Reaction *)0x0;
      pRVar5->sym = pSVar1;
      pRVar5->rlistnext = clist;
      clist = pRVar5;
      ppcVar7 = (char **)emalloc((uint)((ulong)in_stack_ffffffffffffdf40 >> 0x20));
      rlist->capacity = ppcVar7;
      for (local_2c = 0; local_2c < local_30; local_2c = local_2c + 1) {
        rlist->capacity[local_2c] = "";
      }
      if (compartlist != (List *)0x0) {
        local_2090 = compartlist->next;
        while (local_2090 != compartlist) {
          pIVar10 = (local_2090->next->element).itm;
          pIVar3 = local_2090->next->next;
          q2_00 = (pIVar3->element).itm;
          for (pIVar9 = pIVar10->next; pIVar9 != q2_00; pIVar9 = pIVar9->next) {
            in_stack_ffffffffffffdf40 = local_2088;
            pcVar8 = qconcat(pIVar10,q2_00);
            sprintf((char *)in_stack_ffffffffffffdf40,"(%s)",pcVar8);
            pcVar8 = stralloc((char *)in_stack_ffffffffffffdf40,
                              (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38))
            ;
            rlist->capacity[((pIVar9->element).sym)->used + -1] = pcVar8;
          }
          local_2090 = pIVar3->next;
        }
        freelist((List **)in_stack_ffffffffffffdf40);
      }
      for (local_2c = 0x41; local_2c < 0x7b; local_2c = local_2c + 1) {
        for (local_48 = symlist[local_2c]->next; local_48 != symlist[local_2c];
            local_48 = local_48->next) {
          pIVar10 = (local_48->element).itm;
          if (((pIVar10->itemtype == 0x13e) && (((ulong)(pIVar10->element).itm & 0x10) != 0)) &&
             (*(int *)&pIVar10[1].next != 0)) {
            *(undefined4 *)&pIVar10[1].next = 0;
          }
        }
      }
      cvode_sbegin = in_RDX;
      cvode_send = in_RCX;
      kin_items_ = newlist();
      for (local_40 = cvode_sbegin; local_40 != cvode_send->next; local_40 = local_40->next) {
        lappenditem(in_stack_ffffffffffffdf40,
                    (Item *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
      }
      return;
    }
    for (local_78 = local_70->rterm[0]; local_78 != (Rterm *)0x0; local_78 = local_78->rnext) {
      if ((local_78->sym->used == -1) && ((local_78->sym->subtype & 0x20U) == 0)) {
        local_78->sym->varnum = local_28;
        local_30 = local_30 + 1;
        local_78->sym->used = local_30;
        local_28 = local_28 + 1;
        break;
      }
    }
    if (local_78 == (Rterm *)0x0) {
      diag((char *)in_stack_ffffffffffffdf40,
           (char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
    }
    local_70 = local_70->reactnext;
  } while( true );
}

Assistant:

void massagekinetic(q1, q2, q3, q4, sensused) /*KINETIC NAME stmtlist '}'*/
	Item *q1, *q2, *q3,*q4;
	int sensused;
{
	int count = 0, i, order, ncons;
	Item *q, *qs, *afterbrace;
	Item* qv;
	Symbol *s, *fun;
	Reaction *r1;
	Rterm *rt;
	Rlist *r;
	
	fun = SYM(q2);
	if ((fun->subtype & (DERF|KINF)) && fun->u.i) {
		diag("Merging kinetic blocks not implemented", (char *)0);
	}
	fun->subtype |= KINF;
	numlist++;
	fun->u.i = numlist;
	
#if 0
	Sprintf(buf, "static int %s();\n", SYM(q2)->name);
	Linsertstr(procfunc, buf);
	replacstr(q1, "\nstatic int");
#else
	Sprintf(buf,
	  "\n"
	  "/* _kinetic_ %s %s */\n"
	  "#ifndef INSIDE_NMODL\n"
	  "#define INSIDE_NMODL\n"
	  "#endif\n"
	  , SYM(q2)->name, suffix);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint", SYM(q2)->name, suffix);
	replacstr(q1, buf);
	Sprintf(buf, "%s%s<code_to_enable>::operator()", SYM(q2)->name, suffix);
	replacstr(q2, buf);
#endif
	qv = insertstr(q3, "()\n");
#if VECTORIZE
if (vectorize) {
	kin_vect1(q1, q2, q4);
	vectorize_substitute(qv, "(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
}
#endif
	qv = insertstr(q3, "{_reset=0;\n");
#if VECTORIZE
Sprintf(buf, "{int _reset=0;\n");
	vectorize_substitute(qv, buf);
#endif
	afterbrace = q3->next;
#if Glass
 	/* Make sure that if the next statement was LOCAL xxx, we skip
 	past it to do any of the other declarations. DRB */
 	if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,"double")){
 		for(afterbrace = afterbrace->next ;
 			afterbrace->itemtype!=STRING ||
 			strcmp(afterbrace->element.str,";\n") ;
 			afterbrace=afterbrace->next);
 		if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,";\n"))
 			afterbrace=afterbrace->next;
 		}

#endif
	qv = insertstr(afterbrace, "double b_flux, f_flux, _term; int _i;\n");
#if 0 && VECTORIZE
	vectorize_substitute(qv, "int _i;\n");
#endif
	/* also after these declarations will go initilization statements */
	
	order = 0;
	/* the varnum and order of the states is such that diagonals of
	conservation equations must be first.  This is done by setting
	s->used=-1 for all states and then numbering first with respect
	to the conslist and then the remaining that are still -1
	*/
	/* mark only the isstate states */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}
	for (r1 = reactlist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
		for (rt = r1->rterm[1]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}

	/* diagonals of the conservation relations are first */
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
		   if ((rt->sym->used == -1) && !(rt->sym->subtype & ARRAY)) {
				rt->sym->varnum = count++;
				rt->sym->used = ++order; /*first is 1*/
				break;
		   }
		}
		if (!rt) {
		   diag("Failed to diagonalize the Kinetic matrix", (char *)0);
		}
	}
	ncons = count; /* can't use array as conservation diagonal */
	/* others can be in any order */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used == -1) {
			s->varnum = count;
			s->used = ++order; /* count and order  distinct states */
			if (s->subtype & ARRAY) { int dim = s->araydim;
				count += dim;
			}else{
				count++;
			}
		}
	}
	if (count == 0) {
		diag("KINETIC contains no reactions", (char *)0);
	}
	fun->used = count;

	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);
	Sprintf(buf, "_dlist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);

	insertstr(q4, "  } return _reset;\n");
	movelist(q1, q4, procfunc);

	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = reactlist;
	reactlist = (Reaction *)0;
	r->sens_parm = sens_parm;
	r->symorder = (Symbol **)emalloc((unsigned)order*sizeof(Symbol *));
	r->slist_decl = 0;
	/*the reason that we can't just keep this info in s->varnum is that
	more than one block can have the same state with a different varnum */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			r->symorder[s->used - 1] = s;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}
	r->nsym = order;
	r->ncons = ncons;
	r->position = afterbrace;
	r->endbrace = q4->prev;	/* needed for Dstate with COMPARTMENT */
	if (sensused) {
		/* fun now is the interface and fun->used is all the states */
		sensmassage(DERIVATIVE, q2, numlist);
		/* this sets sens_parm to 0 */
	}
	r->sym = fun;
	r->rlistnext = rlist;
	rlist = r;
	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = conslist;
	conslist = (Reaction *)0;
	r->sym = fun;
	r->rlistnext = clist;
	clist = r;

	/* handle compartlist if any */
	rlist->capacity = (char **)emalloc((unsigned)order*sizeof(char *));
	for (i=0; i<order; i++) {
		rlist->capacity[i] = "";
	}
	if (compartlist) {
		char buf1[NRN_BUFSIZE];
		Item *q, *qexp, *qb, *qend, *q1;
		ITERATE(q, compartlist) {
			qexp = ITM(q); q = q->next;
			qb = ITM(q); q = q->next;
			qend = ITM(q);
			for (q1 = qb->next; q1 != qend; q1 = q1->next) {
				Sprintf(buf1, "(%s)", qconcat(qexp, qb->prev));
rlist->capacity[SYM(q1)->used - 1] = stralloc(buf1, (char *)0);
			}
		}
		freelist(&compartlist);
	}

	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
#if CVODE
	cvode_sbegin = q3;
	cvode_send = q4;
	kin_items_ = newlist();
	for (q = cvode_sbegin; q != cvode_send->next; q = q->next) {
		lappenditem(kin_items_, q);
	}
#endif
}